

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::UserGeometry,_embree::Object>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  BuildRef *pBVar4;
  long *plVar5;
  Vec3fx *pVVar6;
  float fVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  BVH *pBVar12;
  ThreadLocal2 *this_00;
  iterator __position;
  BuildRef *pBVar13;
  undefined8 *puVar14;
  ThreadLocal2 *this_01;
  ulong uVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  Geometry *geometry;
  Lock<embree::MutexSys> lock;
  PrimInfo pinfo;
  undefined8 *local_100;
  undefined1 local_f8;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_f0;
  char local_e8;
  __pointer_type local_e0;
  undefined8 *local_d8;
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *local_d0;
  mvector<PrimRef> local_c8;
  RefBuilderSmall *local_a0;
  long *local_98;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  long local_48;
  long local_40;
  
  sVar21 = this->objectID_;
  pGVar11 = (topBuilder->scene->geometries).items[sVar21].ptr;
  geometry = (Geometry *)0x0;
  if ((pGVar11 != (Geometry *)0x0) && (*(char *)&pGVar11->field_8 == '\x1d')) {
    geometry = pGVar11;
  }
  uVar9 = geometry->numPrimitives;
  uVar18 = (ulong)uVar9;
  lVar22 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_c8.alloc.device = (MemoryMonitorInterface *)(lVar22 + 0x550);
  if (lVar22 == 0) {
    local_c8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_c8.alloc.hugepages = false;
  local_c8.size_active = 0;
  local_c8.size_alloced = 0;
  local_c8.items = (PrimRef *)0x0;
  local_a0 = this;
  if (uVar18 != 0) {
    sVar21 = uVar18 << 5;
    (**(local_c8.alloc.device)->_vptr_MemoryMonitorInterface)(local_c8.alloc.device,sVar21,0);
    if (uVar9 < 0xe0000) {
      local_c8.items = (PrimRef *)alignedMalloc(sVar21,0x20);
    }
    else {
      local_c8.items = (PrimRef *)os_malloc(sVar21,&local_c8.alloc.hugepages);
    }
    sVar21 = local_a0->objectID_;
    local_c8.size_alloced = uVar18;
  }
  local_c8.size_active = local_c8.size_alloced;
  sse2::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,geometry,(uint)sVar21,uVar18,&local_c8,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    lVar22 = 0x1c;
    local_98 = (long *)__tls_get_addr(&PTR_021a7d38);
    uVar18 = 0;
    local_d0 = topBuilder;
    do {
      pBVar12 = local_d0->bvh;
      this_01 = (ThreadLocal2 *)*local_98;
      if (this_01 == (ThreadLocal2 *)0x0) {
        this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_01);
        (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_01->alloc0).parent = this_01;
        (this_01->alloc0).ptr = (char *)0x0;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).bytesUsed = 0;
        (this_01->alloc0).bytesWasted = 0;
        (this_01->alloc1).parent = this_01;
        (this_01->alloc1).ptr = (char *)0x0;
        (this_01->alloc1).cur = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).bytesUsed = 0;
        (this_01->alloc1).bytesWasted = 0;
        *local_98 = (long)this_01;
        local_100 = &FastAllocator::s_thread_local_allocators_lock;
        local_f8 = 1;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_f0._M_head_impl = this_01;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_f0);
        if (local_f0._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_f0,
                     local_f0._M_head_impl);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      local_e0 = &pBVar12->alloc;
      uVar19 = (ulong)(((pBVar12->alloc).use_single_mode ^ 1) << 6);
      local_d8 = (undefined8 *)0x8;
      this_00 = *(ThreadLocal2 **)((long)&(this_01->alloc0).parent + uVar19);
      if (local_e0 != (this_00->alloc)._M_b._M_p) {
        local_e8 = '\x01';
        local_f0._M_head_impl = this_00;
        MutexSys::lock(&this_00->mutex);
        if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((this_00->alloc0).end + (this_00->alloc1).end) -
               ((this_00->alloc0).cur + (this_00->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
          UNLOCK();
        }
        (this_00->alloc0).bytesUsed = 0;
        (this_00->alloc0).bytesWasted = 0;
        (this_00->alloc0).end = 0;
        (this_00->alloc0).allocBlockSize = 0;
        (this_00->alloc0).ptr = (char *)0x0;
        (this_00->alloc0).cur = 0;
        (this_00->alloc0).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
        (this_00->alloc1).ptr = (char *)0x0;
        (this_00->alloc1).cur = 0;
        (this_00->alloc1).end = 0;
        (this_00->alloc1).allocBlockSize = 0;
        (this_00->alloc1).bytesUsed = 0;
        (this_00->alloc1).bytesWasted = 0;
        (this_00->alloc1).allocBlockSize = (pBVar12->alloc).defaultBlockSize;
        LOCK();
        (this_00->alloc)._M_b._M_p = local_e0;
        UNLOCK();
        local_100 = &FastAllocator::s_thread_local_allocators_lock;
        local_f8 = 1;
        local_90._M_head_impl = this_00;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar12->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar12->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar12->alloc).thread_local_allocators,__position,&local_90._M_head_impl)
          ;
        }
        else {
          *__position._M_current = local_90._M_head_impl;
          pppTVar2 = &(pBVar12->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if (local_e8 == '\x01') {
          MutexSys::unlock(&(local_f0._M_head_impl)->mutex);
        }
      }
      plVar5 = (long *)((long)&(this_01->alloc0).bytesUsed + uVar19);
      *plVar5 = *plVar5 + (long)local_d8;
      lVar17 = *(long *)((long)&(this_01->alloc0).cur + uVar19);
      uVar20 = (ulong)(-(int)lVar17 & 0xf);
      uVar15 = (long)local_d8 + uVar20 + lVar17;
      *(ulong *)((long)&(this_01->alloc0).cur + uVar19) = uVar15;
      if (*(ulong *)((long)&(this_01->alloc0).end + uVar19) < uVar15) {
        *(long *)((long)&(this_01->alloc0).cur + uVar19) = lVar17;
        puVar14 = *(undefined8 **)((long)&(this_01->alloc0).allocBlockSize + uVar19);
        if (puVar14 < (undefined8 *)((long)local_d8 << 2)) {
          puVar16 = (undefined4 *)FastAllocator::malloc(local_e0,(size_t)&local_d8);
        }
        else {
          local_100 = puVar14;
          puVar16 = (undefined4 *)FastAllocator::malloc(local_e0,(size_t)&local_100);
          *(undefined4 **)((long)&(this_01->alloc0).ptr + uVar19) = puVar16;
          lVar17 = (*(long *)((long)&(this_01->alloc0).end + uVar19) -
                   *(long *)((long)&(this_01->alloc0).cur + uVar19)) +
                   *(long *)((long)&(this_01->alloc0).bytesWasted + uVar19);
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar19) = lVar17;
          *(undefined8 *)((long)&(this_01->alloc0).cur + uVar19) = 0;
          *(undefined8 **)((long)&(this_01->alloc0).end + uVar19) = local_100;
          *(undefined8 **)((long)&(this_01->alloc0).cur + uVar19) = local_d8;
          if (local_100 < local_d8) {
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar19) = 0;
            local_100 = *(undefined8 **)((long)&(this_01->alloc0).allocBlockSize + uVar19);
            puVar16 = (undefined4 *)FastAllocator::malloc(local_e0,(size_t)&local_100);
            *(undefined4 **)((long)&(this_01->alloc0).ptr + uVar19) = puVar16;
            lVar17 = (*(long *)((long)&(this_01->alloc0).end + uVar19) -
                     *(long *)((long)&(this_01->alloc0).cur + uVar19)) +
                     *(long *)((long)&(this_01->alloc0).bytesWasted + uVar19);
            *(long *)((long)&(this_01->alloc0).bytesWasted + uVar19) = lVar17;
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar19) = 0;
            *(undefined8 **)((long)&(this_01->alloc0).end + uVar19) = local_100;
            *(undefined8 **)((long)&(this_01->alloc0).cur + uVar19) = local_d8;
            if (local_100 < local_d8) {
              *(undefined8 *)((long)&(this_01->alloc0).cur + uVar19) = 0;
              puVar16 = (undefined4 *)0x0;
              goto LAB_00cd9b63;
            }
          }
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar19) = lVar17;
        }
      }
      else {
        plVar5 = (long *)((long)&(this_01->alloc0).bytesWasted + uVar19);
        *plVar5 = *plVar5 + uVar20;
        puVar16 = (undefined4 *)
                  ((uVar15 - (long)local_d8) + *(long *)((long)&(this_01->alloc0).ptr + uVar19));
      }
LAB_00cd9b63:
      uVar18 = uVar18 + 1;
      uVar10 = *(undefined4 *)((long)&((local_c8.items)->lower).field_0 + lVar22);
      *puVar16 = *(undefined4 *)((long)local_c8.items + lVar22 + -0x10);
      puVar16[1] = uVar10;
      fVar7 = *(float *)&local_a0->objectID_;
      LOCK();
      paVar3 = &local_d0->nextRef;
      iVar8 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar13 = (local_d0->refs).items;
      pBVar4 = pBVar13 + iVar8;
      (pBVar4->super_PrimRef).lower.field_0.m128[0] = local_88.m128[0];
      (pBVar4->super_PrimRef).lower.field_0.m128[1] = local_88.m128[1];
      (pBVar4->super_PrimRef).lower.field_0.m128[2] = local_88.m128[2];
      (pBVar4->super_PrimRef).lower.field_0.m128[3] = fVar7;
      pVVar6 = &pBVar13[iVar8].super_PrimRef.upper;
      (pVVar6->field_0).m128[0] = local_78;
      (pVVar6->field_0).m128[1] = fStack_74;
      (pVVar6->field_0).m128[2] = fStack_70;
      (pVVar6->field_0).m128[3] = 1.4013e-45;
      pBVar13[iVar8].node.ptr = (ulong)puVar16 | 9;
      pBVar13[iVar8].bounds_area = 0.0;
      lVar22 = lVar22 + 0x20;
    } while (uVar18 < (ulong)(local_40 - local_48));
  }
  sVar21 = local_c8.size_alloced;
  if (local_c8.items != (PrimRef *)0x0) {
    if (local_c8.size_alloced << 5 < 0x1c00000) {
      alignedFree(local_c8.items);
    }
    else {
      os_free(local_c8.items,local_c8.size_alloced << 5,local_c8.alloc.hugepages);
    }
  }
  if (sVar21 != 0) {
    (**(local_c8.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_c8.alloc.device,sVar21 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }